

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O3

void __thiscall FScriptPosition::Message(FScriptPosition *this,int severity,char *message,...)

{
  char in_AL;
  undefined8 in_RCX;
  char *pcVar1;
  char *pcVar2;
  int printlevel;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  FString composed;
  va_list arglist;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  composed.Chars = FString::NullString.Nothing;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  switch(severity) {
  case 3:
    severity = 2;
    if (!StrictErrors) {
      severity = (uint)strictdecorate.Value * 2;
    }
    break;
  case 4:
    severity = 4;
    if (developer.Value < 1) goto switchD_00486bcd_caseD_3;
    break;
  case 5:
    severity = 5;
    if (developer.Value < 2) goto switchD_00486bcd_caseD_3;
    break;
  case 6:
    severity = 6;
    goto LAB_00486b4d;
  case 8:
    severity = 8;
LAB_00486b4d:
    if (developer.Value < 3) goto switchD_00486bcd_caseD_3;
  }
  if (message == (char *)0x0) {
    FString::operator=(&composed,"Bad syntax.");
  }
  else {
    arglist[0].reg_save_area = local_c8;
    arglist[0].overflow_arg_area = &stack0x00000008;
    arglist[0].gp_offset = 0x18;
    arglist[0].fp_offset = 0x30;
    FString::VFormat(&composed,message,arglist);
  }
  printlevel = 2;
  pcVar1 = "message";
  switch(severity) {
  case 0:
  case 4:
  case 5:
    WarnCounter = WarnCounter + 1;
    pcVar2 = "\x1cI";
    pcVar1 = "warning";
    break;
  case 1:
    I_Error("Script error, \"%s\" line %d:\n%s\n",(this->FileName).Chars,
            (ulong)(uint)this->ScriptLine,composed.Chars);
    goto switchD_00486bcd_caseD_3;
  case 2:
    ErrorCounter = ErrorCounter + 1;
    pcVar2 = "\x1cG";
    pcVar1 = "error";
    break;
  default:
    goto switchD_00486bcd_caseD_3;
  case 6:
  case 9:
    pcVar2 = "\x1cD";
    break;
  case 7:
  case 8:
    printlevel = 5;
    pcVar2 = "";
  }
  Printf(printlevel,"%sScript %s, \"%s\" line %d:\n%s%s\n",pcVar2,pcVar1,(this->FileName).Chars,
         (ulong)(uint)this->ScriptLine,pcVar2,composed.Chars);
switchD_00486bcd_caseD_3:
  FString::~FString(&composed);
  return;
}

Assistant:

void FScriptPosition::Message (int severity, const char *message, ...) const
{
	FString composed;

	if (severity == MSG_DEBUGLOG && developer < DMSG_NOTIFY) return;
	if (severity == MSG_DEBUGERROR && developer < DMSG_ERROR) return;
	if (severity == MSG_DEBUGWARN && developer < DMSG_WARNING) return;
	if (severity == MSG_DEBUGMSG && developer < DMSG_NOTIFY) return;
	if (severity == MSG_OPTERROR)
	{
		severity = StrictErrors || strictdecorate ? MSG_ERROR : MSG_WARNING;
	}

	if (message == NULL)
	{
		composed = "Bad syntax.";
	}
	else
	{
		va_list arglist;
		va_start (arglist, message);
		composed.VFormat (message, arglist);
		va_end (arglist);
	}
	const char *type = "";
	const char *color;
	int level = PRINT_HIGH;

	switch (severity)
	{
	default:
		return;

	case MSG_WARNING:
	case MSG_DEBUGWARN:
	case MSG_DEBUGERROR:	// This is intentionally not being printed as an 'error', the difference to MSG_DEBUGWARN is only the severity level at which it gets triggered.
		WarnCounter++;
		type = "warning";
		color = TEXTCOLOR_ORANGE;
		break;

	case MSG_ERROR:
		ErrorCounter++;
		type = "error";
		color = TEXTCOLOR_RED;
		break;

	case MSG_MESSAGE:
	case MSG_DEBUGMSG:
		type = "message";
		color = TEXTCOLOR_GREEN;
		break;

	case MSG_DEBUGLOG:
	case MSG_LOG:
		type = "message";
		level = PRINT_LOG;
		color = "";
		break;

	case MSG_FATAL:
		I_Error ("Script error, \"%s\" line %d:\n%s\n",
			FileName.GetChars(), ScriptLine, composed.GetChars());
		return;
	}
	Printf (level, "%sScript %s, \"%s\" line %d:\n%s%s\n",
		color, type, FileName.GetChars(), ScriptLine, color, composed.GetChars());
}